

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O0

void __thiscall vkt::anon_unknown_0::TaskExecutor::~TaskExecutor(TaskExecutor *this)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  TaskExecutorThread *this_01;
  ulong local_28;
  size_t ndx_1;
  ulong local_18;
  size_t ndx;
  TaskExecutor *this_local;
  
  local_18 = 0;
  ndx = (size_t)this;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::
            vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
            ::size(&this->m_threads);
    if (sVar2 <= uVar1) break;
    ndx_1 = 0;
    de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::pushFront
              (&this->m_tasks,(Task **)&ndx_1);
    local_18 = local_18 + 1;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
            ::size(&this->m_threads);
    if (sVar2 <= local_28) break;
    this_00 = std::
              vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
              ::operator[](&this->m_threads,local_28);
    this_01 = de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>::operator->(this_00);
    de::Thread::join(&this_01->super_Thread);
    local_28 = local_28 + 1;
  }
  de::ThreadSafeRingBuffer<vkt::(anonymous_namespace)::Task_*>::~ThreadSafeRingBuffer
            (&this->m_tasks);
  std::
  vector<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::TaskExecutorThread>_>_>
  ::~vector(&this->m_threads);
  return;
}

Assistant:

TaskExecutor::~TaskExecutor (void)
{
	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_tasks.pushFront(DE_NULL);

	for (size_t ndx = 0; ndx < m_threads.size(); ++ndx)
		m_threads[ndx]->join();
}